

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::queryMarketDataRequest(Application *this)

{
  int iVar1;
  ostream *this_00;
  void *this_01;
  allocator<char> local_5a9;
  string local_5a8 [32];
  MarketDataRequest local_588;
  MarketDataRequest local_430;
  MarketDataRequest local_2c8;
  Message local_170 [8];
  Message md;
  int version;
  Application *this_local;
  
  iVar1 = queryVersion(this);
  std::operator<<((ostream *)&std::cout,"\nMarketDataRequest\n");
  FIX::Message::Message(local_170);
  if (iVar1 == 0x2b) {
    queryMarketDataRequest43(&local_2c8,this);
    FIX::Message::operator=(local_170,(Message *)&local_2c8);
    FIX43::MarketDataRequest::~MarketDataRequest(&local_2c8);
  }
  else if (iVar1 == 0x2c) {
    queryMarketDataRequest44(&local_430,this);
    FIX::Message::operator=(local_170,(Message *)&local_430);
    FIX44::MarketDataRequest::~MarketDataRequest(&local_430);
  }
  else if (iVar1 == 0x32) {
    queryMarketDataRequest50(&local_588,this);
    FIX::Message::operator=(local_170,(Message *)&local_588);
    FIX50::MarketDataRequest::~MarketDataRequest(&local_588);
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,"No test for version ");
    this_01 = (void *)std::ostream::operator<<(this_00,iVar1);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5a8,"",&local_5a9);
  FIX::Session::sendToTarget(local_170,local_5a8);
  std::__cxx11::string::~string(local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  FIX::Message::~Message(local_170);
  return;
}

Assistant:

void Application::queryMarketDataRequest() {
  int version = queryVersion();
  std::cout << "\nMarketDataRequest\n";
  FIX::Message md;

  switch (version) {
  case 43:
    md = queryMarketDataRequest43();
    break;
  case 44:
    md = queryMarketDataRequest44();
    break;
  case 50:
    md = queryMarketDataRequest50();
    break;
  default:
    std::cerr << "No test for version " << version << std::endl;
    break;
  }

  FIX::Session::sendToTarget(md);
}